

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int *piVar8;
  undefined8 *puVar9;
  void *pvVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  int iVar18;
  ulong uVar19;
  short sVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  parasail_result_t *ppVar25;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  long lVar26;
  ulong uVar27;
  short sVar28;
  ulong uVar29;
  short sVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  short sVar38;
  uint s2Len_00;
  uint uVar39;
  uint uVar40;
  int32_t i;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  short sVar44;
  undefined4 uVar45;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar51;
  short sVar52;
  short sVar57;
  undefined1 auVar50 [16];
  undefined4 uVar58;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ushort uVar68;
  ushort uVar69;
  short sVar70;
  ushort uVar71;
  undefined4 uVar72;
  short sVar77;
  short sVar79;
  short sVar81;
  short sVar83;
  short sVar85;
  undefined1 auVar73 [16];
  short sVar75;
  ushort uVar76;
  ushort uVar78;
  ushort uVar80;
  ushort uVar82;
  ushort uVar84;
  ushort uVar86;
  short sVar87;
  ushort uVar88;
  undefined1 auVar74 [16];
  short sVar89;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  undefined1 auVar90 [16];
  short sVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  long lVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  long lVar115;
  undefined1 auVar116 [16];
  long lVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 in_XMM15 [16];
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  int32_t in_stack_fffffffffffffca8;
  uint local_34c;
  undefined1 local_348 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2c8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  short local_288;
  short sStack_286;
  undefined1 local_278 [16];
  undefined1 local_258 [16];
  short local_248;
  short sStack_246;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  short sVar128;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  short sVar138;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_8();
  }
  else {
    uVar27 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_7();
    }
    else if (open < 0) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_6();
    }
    else if (gap < 0) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_5();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_4();
    }
    else {
      uVar33 = (ulong)(uint)_s1Len;
      if (matrix->type == 1) {
        if (_s1 == (char *)0x0) {
          parasail_nw_stats_rowcol_diag_sse41_128_16_cold_3();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        if (_s1 == (char *)0x0) {
          parasail_nw_stats_rowcol_diag_sse41_128_16_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_nw_stats_rowcol_diag_sse41_128_16_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      if (matrix->type != 0) {
        uVar33 = (ulong)(uint)matrix->length;
      }
      iVar34 = -open;
      iVar36 = matrix->min;
      iVar23 = -iVar36;
      if (iVar36 != iVar34 && SBORROW4(iVar36,iVar34) == iVar36 + open < 0) {
        iVar23 = open;
      }
      iVar18 = matrix->max;
      uVar32 = (uint)uVar33;
      ppVar25 = parasail_result_new_rowcol3(uVar32,s2Len);
      if (ppVar25 != (parasail_result_t *)0x0) {
        iVar21 = uVar32 + 7;
        ppVar25->flag = ppVar25->flag | 0x8251001;
        ptr = parasail_memalign_int16_t(0x10,(long)iVar21);
        uVar29 = (ulong)(s2Len + 0xe);
        ptr_00 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_01 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_02 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_03 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_04 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_05 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_06 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_07 = parasail_memalign_int16_t(0x10,uVar29);
        ptr_08 = parasail_memalign_int16_t(0x10,uVar29);
        if ((ptr_08 != (int16_t *)0x0 &&
            (ptr_07 != (int16_t *)0x0 && (ptr_06 != (int16_t *)0x0 && ptr_05 != (int16_t *)0x0))) &&
            ((ptr_04 != (int16_t *)0x0 && (ptr_03 != (int16_t *)0x0 && ptr_02 != (int16_t *)0x0)) &&
            ((ptr_01 != (int16_t *)0x0 && ptr_00 != (int16_t *)0x0) && ptr != (int16_t *)0x0))) {
          s2Len_00 = iVar23 - 0x7fff;
          auVar46 = pshuflw(ZEXT416(s2Len_00),ZEXT416(s2Len_00),0);
          uVar45 = auVar46._0_4_;
          local_288 = auVar46._0_2_;
          sStack_286 = auVar46._2_2_;
          auVar46 = ZEXT416(CONCAT22((short)((uint)iVar36 >> 0x10),0x7ffe - (short)iVar18));
          auVar46 = pshuflw(auVar46,auVar46,0);
          auVar59 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
          auVar73 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
          uVar72 = auVar73._0_4_;
          auVar73 = pshuflw(ZEXT416(uVar32),ZEXT416(uVar32),0);
          local_238._4_4_ = auVar73._0_4_;
          local_238._0_4_ = local_238._4_4_;
          local_238._8_4_ = local_238._4_4_;
          local_238._12_4_ = local_238._4_4_;
          auVar73._8_4_ = 0xffffffff;
          auVar73._0_8_ = 0xffffffffffffffff;
          auVar73._12_4_ = 0xffffffff;
          auVar90 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
          local_1f8._4_4_ = auVar90._0_4_;
          local_1f8._0_4_ = local_1f8._4_4_;
          local_1f8._8_4_ = local_1f8._4_4_;
          local_1f8._12_4_ = local_1f8._4_4_;
          sVar28 = (short)gap;
          sVar20 = (short)iVar34;
          sVar30 = (short)open;
          local_278._10_2_ = sVar20 + sVar28 * -2;
          local_278._8_2_ = sVar28 * -3 - sVar30;
          local_278._12_2_ = sVar20 - sVar28;
          if (0 < (int)uVar32) {
            piVar8 = matrix->mapper;
            uVar29 = 0;
            do {
              ptr[uVar29] = (int16_t)piVar8[(byte)_s1[uVar29]];
              uVar29 = uVar29 + 1;
            } while (uVar33 != uVar29);
          }
          uVar22 = s2Len + 7;
          local_34c = uVar32 - 1;
          iVar23 = s2Len + -1;
          local_248 = auVar46._0_2_;
          sStack_246 = auVar46._2_2_;
          uVar58 = auVar59._0_4_;
          local_228 = ZEXT216((ushort)s2Len_00) << 0x70;
          auVar90._4_4_ = uVar72;
          auVar90._0_4_ = uVar72;
          auVar90._8_4_ = uVar72;
          auVar90._12_4_ = uVar72;
          auVar90 = psllw(auVar90,3);
          auVar47 = paddsw(local_238,auVar73);
          auVar73 = paddsw(local_1f8,auVar73);
          local_278._14_2_ = sVar20;
          local_278._0_8_ =
               (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
               (ulong)(ushort)(sVar28 * -6 - sVar30) << 0x10 |
               (ulong)(ushort)(sVar28 * -5 - sVar30) << 0x20 |
               (ulong)(ushort)(sVar20 + sVar28 * -4) << 0x30;
          iVar36 = uVar32 + 1;
          if ((int)(uVar32 + 1) < iVar21) {
            iVar36 = iVar21;
          }
          uVar41 = 0;
          memset(ptr + (int)uVar32,0,(ulong)(~uVar32 + iVar36) * 2 + 2);
          piVar8 = matrix->mapper;
          uVar29 = 1;
          if (1 < s2Len) {
            uVar29 = uVar27;
          }
          do {
            ptr_00[uVar41 + 7] = (int16_t)piVar8[(byte)_s2[uVar41]];
            uVar41 = uVar41 + 1;
          } while (uVar29 != uVar41);
          ptr_00[3] = 0;
          ptr_00[4] = 0;
          ptr_00[5] = 0;
          ptr_00[6] = 0;
          ptr_00[0] = 0;
          ptr_00[1] = 0;
          ptr_00[2] = 0;
          ptr_00[3] = 0;
          uVar24 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar22) {
            uVar24 = uVar22;
          }
          memset(ptr_00 + uVar27 + 7,0,(ulong)(~s2Len + uVar24) * 2 + 2);
          lVar26 = 0;
          do {
            *(short *)((long)ptr_01 + lVar26 + 0xe) = (short)iVar34;
            iVar34 = iVar34 - gap;
            *(undefined2 *)((long)ptr_02 + lVar26 + 0xe) = 0;
            *(undefined2 *)((long)ptr_03 + lVar26 + 0xe) = 0;
            *(undefined2 *)((long)ptr_04 + lVar26 + 0xe) = 0;
            *(short *)((long)ptr_05 + lVar26 + 0xe) = (short)s2Len_00;
            *(undefined2 *)((long)ptr_06 + lVar26 + 0xe) = 0;
            *(undefined2 *)((long)ptr_07 + lVar26 + 0xe) = 0;
            *(undefined2 *)((long)ptr_08 + lVar26 + 0xe) = 0;
            lVar26 = lVar26 + 2;
          } while (uVar29 * 2 != lVar26);
          lVar26 = 0;
          do {
            *(undefined2 *)((long)ptr_01 + lVar26) = 0;
            *(undefined2 *)((long)ptr_02 + lVar26) = 0;
            *(undefined2 *)((long)ptr_03 + lVar26) = 0;
            *(undefined2 *)((long)ptr_04 + lVar26) = 0;
            *(undefined2 *)((long)ptr_05 + lVar26) = 0;
            *(undefined2 *)((long)ptr_06 + lVar26) = 0;
            *(undefined2 *)((long)ptr_07 + lVar26) = 0;
            *(undefined2 *)((long)ptr_08 + lVar26) = 0;
            lVar26 = lVar26 + 2;
          } while (lVar26 != 0xe);
          lVar26 = 0;
          do {
            ptr_01[uVar27 + lVar26 + 7] = 0;
            ptr_02[uVar27 + lVar26 + 7] = 0;
            ptr_03[uVar27 + lVar26 + 7] = 0;
            ptr_04[uVar27 + lVar26 + 7] = 0;
            ptr_05[uVar27 + lVar26 + 7] = 0;
            ptr_06[uVar27 + lVar26 + 7] = 0;
            ptr_07[uVar27 + lVar26 + 7] = 0;
            ptr_08[uVar27 + lVar26 + 7] = 0;
            lVar26 = lVar26 + 1;
          } while (s2Len + (int)lVar26 < (int)uVar22);
          ptr_01[6] = 0;
          if ((int)uVar32 < 1) {
            local_208._4_2_ = local_288;
            local_208._0_4_ = uVar45;
            local_208._6_2_ = sStack_286;
            local_208._8_2_ = local_288;
            local_208._10_2_ = sStack_286;
            local_208._12_2_ = local_288;
            local_208._14_2_ = sStack_286;
            auVar59 = local_208;
            auVar46 = local_208;
            auVar114 = local_208;
            auVar116 = local_208;
            local_218._0_2_ = local_248;
            local_218._2_2_ = sStack_246;
            local_218._4_2_ = local_248;
            local_218._6_2_ = sStack_246;
            uStack_210._0_2_ = local_248;
            uStack_210._2_2_ = sStack_246;
            uStack_210._4_2_ = local_248;
            uStack_210._6_2_ = sStack_246;
          }
          else {
            uVar27 = 1;
            if (1 < (int)uVar22) {
              uVar27 = (ulong)uVar22;
            }
            auVar60 = pmovsxbw(auVar59,0x1020304050607);
            auVar59._4_2_ = local_288;
            auVar59._0_4_ = uVar45;
            auVar59._6_2_ = sStack_286;
            auVar59._8_2_ = local_288;
            auVar59._10_2_ = sStack_286;
            auVar59._12_2_ = local_288;
            auVar59._14_2_ = sStack_286;
            local_218 = CONCAT26(sStack_246,CONCAT24(local_248,auVar46._0_4_));
            uStack_210 = CONCAT26(sStack_246,CONCAT24(local_248,auVar46._0_4_));
            uVar29 = 0;
            auVar46 = auVar59;
            auVar114 = auVar59;
            auVar116 = auVar59;
            local_208 = auVar59;
            do {
              sVar30 = ptr[uVar29 + 7];
              iVar36 = matrix->type;
              uVar32 = (uint)uVar29;
              uVar22 = uVar32 | 7;
              if (uVar33 <= (uVar29 | 7)) {
                uVar22 = local_34c;
              }
              if (iVar36 == 0) {
                uVar22 = (int)sVar30;
              }
              uVar24 = uVar32 | 6;
              if (uVar33 <= (uVar29 | 6)) {
                uVar24 = local_34c;
              }
              sVar38 = ptr[uVar29 + 6];
              if (iVar36 == 0) {
                uVar24 = (int)sVar38;
              }
              uVar31 = uVar32 | 5;
              if (uVar33 <= (uVar29 | 5)) {
                uVar31 = local_34c;
              }
              sVar1 = ptr[uVar29 + 5];
              if (iVar36 == 0) {
                uVar31 = (int)sVar1;
              }
              uVar35 = uVar32 | 4;
              if (uVar33 <= (uVar29 | 4)) {
                uVar35 = local_34c;
              }
              sVar2 = ptr[uVar29 + 4];
              if (iVar36 == 0) {
                uVar35 = (int)sVar2;
              }
              uVar37 = uVar32 | 3;
              if (uVar33 <= (uVar29 | 3)) {
                uVar37 = local_34c;
              }
              sVar3 = ptr[uVar29 + 3];
              if (iVar36 == 0) {
                uVar37 = (int)sVar3;
              }
              uVar39 = uVar32 | 2;
              if (uVar33 <= (uVar29 | 2)) {
                uVar39 = local_34c;
              }
              sVar4 = ptr[uVar29 + 2];
              if (iVar36 == 0) {
                uVar39 = (int)sVar4;
              }
              uVar40 = uVar32 | 1;
              if (uVar33 <= (uVar29 | 1)) {
                uVar40 = local_34c;
              }
              sVar5 = ptr[uVar29];
              sVar6 = ptr[uVar29 + 1];
              piVar8 = matrix->matrix;
              if (iVar36 == 0) {
                uVar40 = (int)sVar6;
                uVar32 = (int)sVar5;
              }
              iVar36 = matrix->size;
              uVar43 = uVar29 + 8;
              auVar131 = ZEXT216((ushort)(sVar20 - (short)uVar29 * sVar28)) << 0x70;
              uVar71 = ptr_01[6];
              ptr_01[6] = sVar20 - (short)uVar43 * sVar28;
              local_238._0_2_ = auVar47._0_2_;
              local_238._2_2_ = auVar47._2_2_;
              local_238._4_2_ = auVar47._4_2_;
              local_238._6_2_ = auVar47._6_2_;
              local_238._8_2_ = auVar47._8_2_;
              local_238._10_2_ = auVar47._10_2_;
              local_238._12_2_ = auVar47._12_2_;
              local_238._14_2_ = auVar47._14_2_;
              uVar42 = 0;
              local_298 = CONCAT26(sStack_286,CONCAT24(local_288,uVar45));
              uStack_290 = CONCAT26(sStack_286,CONCAT24(local_288,uVar45));
              in_XMM15 = pmovsxbw(in_XMM15,0xfffefdfcfbfaf9);
              auVar121 = (undefined1  [16])0x0;
              auVar118 = (undefined1  [16])0x0;
              auVar61 = (undefined1  [16])0x0;
              local_c8 = 0;
              uStack_c0 = 0;
              local_1e8 = 0;
              uStack_1e0 = 0;
              local_1d8 = 0;
              uStack_1d0 = 0;
              local_138 = local_228;
              auVar108._0_8_ = 0;
              uVar41 = 0;
              local_348 = (undefined1  [16])0x0;
              local_308 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_258 = (undefined1  [16])0x0;
              local_128 = (undefined1  [16])0x0;
              auVar49 = local_228;
              auVar126 = ZEXT216(uVar71) << 0x70;
              do {
                local_1c8._8_8_ = uStack_1d0;
                local_1c8._0_8_ = local_1d8;
                local_1a8._8_8_ = uStack_c0;
                local_1a8._0_8_ = local_c8;
                local_2f8._8_8_ = uStack_1e0;
                local_2f8._0_8_ = local_1e8;
                local_1b8._8_8_ = uVar41;
                local_1b8._0_8_ = auVar108._0_8_;
                auVar48._0_8_ = auVar131._2_8_;
                auVar48._8_8_ = auVar131._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar42 + 7] << 0x30;
                auVar108._0_8_ = local_2c8._2_8_;
                uVar41 = local_2c8._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar42 + 7] << 0x30;
                auVar108._8_8_ = uVar41;
                auVar106._0_8_ = local_308._2_8_;
                auVar106._8_8_ = local_308._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar42 + 7] << 0x30
                ;
                auVar123._0_8_ = auVar49._2_8_;
                auVar123._8_8_ = auVar49._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar42 + 7] << 0x30;
                auVar125._0_8_ = auVar61._2_8_;
                auVar125._8_8_ = auVar61._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar42 + 7] << 0x30;
                auVar119._0_8_ = auVar118._2_8_;
                auVar119._8_8_ = auVar118._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar42 + 7] << 0x30;
                auVar110._4_4_ = uVar58;
                auVar110._0_4_ = uVar58;
                auVar110._8_4_ = uVar58;
                auVar110._12_4_ = uVar58;
                auVar49 = psubsw(auVar48,auVar110);
                auVar107._4_4_ = uVar72;
                auVar107._0_4_ = uVar72;
                auVar107._8_4_ = uVar72;
                auVar107._12_4_ = uVar72;
                auVar61 = psubsw(auVar123,auVar107);
                sVar44 = auVar49._0_2_;
                sVar70 = auVar61._0_2_;
                auVar112._0_2_ = -(ushort)(sVar70 < sVar44);
                sVar51 = auVar49._2_2_;
                sVar75 = auVar61._2_2_;
                auVar112._2_2_ = -(ushort)(sVar75 < sVar51);
                sVar53 = auVar49._4_2_;
                sVar77 = auVar61._4_2_;
                auVar112._4_2_ = -(ushort)(sVar77 < sVar53);
                sVar54 = auVar49._6_2_;
                sVar79 = auVar61._6_2_;
                auVar112._6_2_ = -(ushort)(sVar79 < sVar54);
                sVar52 = auVar49._8_2_;
                sVar81 = auVar61._8_2_;
                auVar112._8_2_ = -(ushort)(sVar81 < sVar52);
                sVar55 = auVar49._10_2_;
                sVar83 = auVar61._10_2_;
                auVar112._10_2_ = -(ushort)(sVar83 < sVar55);
                sVar56 = auVar49._12_2_;
                sVar85 = auVar61._12_2_;
                sVar57 = auVar49._14_2_;
                auVar112._12_2_ = -(ushort)(sVar85 < sVar56);
                sVar87 = auVar61._14_2_;
                auVar112._14_2_ = -(ushort)(sVar87 < sVar57);
                auVar61 = pblendvb(auVar125,auVar108,auVar112);
                auVar118 = pblendvb(auVar119,auVar106,auVar112);
                auVar109._0_8_ = local_348._2_8_;
                auVar109._8_8_ = local_348._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar42 + 7] << 0x30
                ;
                auVar122._0_8_ = auVar121._2_8_;
                auVar122._8_8_ = auVar121._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar42 + 7] << 0x30;
                auVar123 = pblendvb(auVar122,auVar109,auVar112);
                auVar121 = psubsw(auVar131,auVar110);
                auVar49 = psubsw(local_138,auVar107);
                sVar89 = auVar49._0_2_;
                sVar128 = auVar121._0_2_;
                auVar129._0_2_ = -(ushort)(sVar89 < sVar128);
                sVar91 = auVar49._2_2_;
                sVar132 = auVar121._2_2_;
                auVar129._2_2_ = -(ushort)(sVar91 < sVar132);
                sVar92 = auVar49._4_2_;
                sVar133 = auVar121._4_2_;
                auVar129._4_2_ = -(ushort)(sVar92 < sVar133);
                sVar93 = auVar49._6_2_;
                sVar134 = auVar121._6_2_;
                auVar129._6_2_ = -(ushort)(sVar93 < sVar134);
                sVar94 = auVar49._8_2_;
                sVar135 = auVar121._8_2_;
                auVar129._8_2_ = -(ushort)(sVar94 < sVar135);
                sVar95 = auVar49._10_2_;
                sVar136 = auVar121._10_2_;
                auVar129._10_2_ = -(ushort)(sVar95 < sVar136);
                sVar96 = auVar49._12_2_;
                sVar137 = auVar121._12_2_;
                sVar138 = auVar121._14_2_;
                auVar129._12_2_ = -(ushort)(sVar96 < sVar137);
                sVar97 = auVar49._14_2_;
                auVar129._14_2_ = -(ushort)(sVar97 < sVar138);
                auVar107 = pblendvb(local_1c8,local_2c8,auVar129);
                auVar110 = pblendvb(local_2f8,local_308,auVar129);
                auVar121._10_2_ =
                     (short)piVar8[(long)(int)(uVar39 * iVar36) + (long)ptr_00[uVar42 + 5]];
                auVar121._8_2_ =
                     (short)piVar8[(long)(int)(uVar37 * iVar36) + (long)ptr_00[uVar42 + 4]];
                auVar121._12_2_ =
                     (short)piVar8[(long)(int)(uVar40 * iVar36) + (long)ptr_00[uVar42 + 6]];
                sVar7 = ptr_00[uVar42 + 7];
                auVar124._0_2_ = (ushort)-(ushort)(sVar30 == local_298._2_2_) >> 0xf;
                auVar124._2_2_ = (ushort)-(ushort)(sVar38 == local_298._4_2_) >> 0xf;
                auVar124._4_2_ = (ushort)-(ushort)(sVar1 == local_298._6_2_) >> 0xf;
                auVar124._6_2_ = (ushort)-(ushort)(sVar2 == (short)uStack_290) >> 0xf;
                auVar124._8_2_ = (ushort)-(ushort)(sVar3 == uStack_290._2_2_) >> 0xf;
                auVar124._10_2_ = (ushort)-(ushort)(sVar4 == uStack_290._4_2_) >> 0xf;
                auVar124._12_2_ = (ushort)-(ushort)(sVar6 == uStack_290._6_2_) >> 0xf;
                auVar124._14_2_ = (ushort)-(ushort)(sVar5 == sVar7) >> 0xf;
                auVar125 = paddsw(auVar124,local_1b8);
                auVar121._14_2_ = (short)piVar8[(long)(int)(uVar32 * iVar36) + (long)sVar7];
                auVar121._0_8_ =
                     (ulong)(uint)piVar8[(long)(int)(uVar22 * iVar36) + (long)ptr_00[uVar42]] &
                     0xffffffff0000ffff |
                     (ulong)*(ushort *)
                             (piVar8 + (long)(int)(uVar24 * iVar36) + (long)ptr_00[uVar42 + 1]) <<
                     0x10 | (ulong)*(ushort *)
                                    (piVar8 + (long)(int)(uVar31 * iVar36) +
                                              (long)ptr_00[uVar42 + 2]) << 0x20 |
                     (ulong)*(ushort *)
                             (piVar8 + (long)(int)(uVar35 * iVar36) + (long)ptr_00[uVar42 + 3]) <<
                     0x30;
                uVar98 = (ushort)(sVar44 < sVar70) * sVar70 | (ushort)(sVar44 >= sVar70) * sVar44;
                uVar99 = (ushort)(sVar51 < sVar75) * sVar75 | (ushort)(sVar51 >= sVar75) * sVar51;
                uVar100 = (ushort)(sVar53 < sVar77) * sVar77 | (ushort)(sVar53 >= sVar77) * sVar53;
                uVar101 = (ushort)(sVar54 < sVar79) * sVar79 | (ushort)(sVar54 >= sVar79) * sVar54;
                uVar102 = (ushort)(sVar52 < sVar81) * sVar81 | (ushort)(sVar52 >= sVar81) * sVar52;
                uVar103 = (ushort)(sVar55 < sVar83) * sVar83 | (ushort)(sVar55 >= sVar83) * sVar55;
                uVar104 = (ushort)(sVar56 < sVar85) * sVar85 | (ushort)(sVar56 >= sVar85) * sVar56;
                uVar105 = (ushort)(sVar57 < sVar87) * sVar87 | (ushort)(sVar57 >= sVar87) * sVar57;
                auVar113._0_2_ =
                     (ushort)(sVar128 < sVar89) * sVar89 | (ushort)(sVar128 >= sVar89) * sVar128;
                auVar113._2_2_ =
                     (ushort)(sVar132 < sVar91) * sVar91 | (ushort)(sVar132 >= sVar91) * sVar132;
                auVar113._4_2_ =
                     (ushort)(sVar133 < sVar92) * sVar92 | (ushort)(sVar133 >= sVar92) * sVar133;
                auVar113._6_2_ =
                     (ushort)(sVar134 < sVar93) * sVar93 | (ushort)(sVar134 >= sVar93) * sVar134;
                auVar113._8_2_ =
                     (ushort)(sVar135 < sVar94) * sVar94 | (ushort)(sVar135 >= sVar94) * sVar135;
                auVar113._10_2_ =
                     (ushort)(sVar136 < sVar95) * sVar95 | (ushort)(sVar136 >= sVar95) * sVar136;
                auVar113._12_2_ =
                     (ushort)(sVar137 < sVar96) * sVar96 | (ushort)(sVar137 >= sVar96) * sVar137;
                auVar113._14_2_ =
                     (ushort)(sVar138 < sVar97) * sVar97 | (ushort)(sVar138 >= sVar97) * sVar138;
                auVar112 = pblendvb(local_1a8,local_348,auVar129);
                auVar49 = paddsw(auVar126,auVar121);
                uVar62 = auVar49._0_2_;
                uVar71 = ((short)uVar62 < (short)auVar113._0_2_) * auVar113._0_2_ |
                         ((short)uVar62 >= (short)auVar113._0_2_) * uVar62;
                uVar64 = auVar49._2_2_;
                uVar76 = ((short)uVar64 < (short)auVar113._2_2_) * auVar113._2_2_ |
                         ((short)uVar64 >= (short)auVar113._2_2_) * uVar64;
                uVar66 = auVar49._4_2_;
                uVar78 = ((short)uVar66 < (short)auVar113._4_2_) * auVar113._4_2_ |
                         ((short)uVar66 >= (short)auVar113._4_2_) * uVar66;
                uVar68 = auVar49._6_2_;
                uVar80 = ((short)uVar68 < (short)auVar113._6_2_) * auVar113._6_2_ |
                         ((short)uVar68 >= (short)auVar113._6_2_) * uVar68;
                uVar63 = auVar49._8_2_;
                uVar82 = ((short)uVar63 < (short)auVar113._8_2_) * auVar113._8_2_ |
                         ((short)uVar63 >= (short)auVar113._8_2_) * uVar63;
                uVar65 = auVar49._10_2_;
                uVar84 = ((short)uVar65 < (short)auVar113._10_2_) * auVar113._10_2_ |
                         ((short)uVar65 >= (short)auVar113._10_2_) * uVar65;
                uVar67 = auVar49._12_2_;
                uVar69 = auVar49._14_2_;
                uVar86 = ((short)uVar67 < (short)auVar113._12_2_) * auVar113._12_2_ |
                         ((short)uVar67 >= (short)auVar113._12_2_) * uVar67;
                uVar88 = ((short)uVar69 < (short)auVar113._14_2_) * auVar113._14_2_ |
                         ((short)uVar69 >= (short)auVar113._14_2_) * uVar69;
                auVar130._0_2_ =
                     ((short)uVar71 < (short)uVar98) * uVar98 |
                     ((short)uVar71 >= (short)uVar98) * uVar71;
                auVar130._2_2_ =
                     ((short)uVar76 < (short)uVar99) * uVar99 |
                     ((short)uVar76 >= (short)uVar99) * uVar76;
                auVar130._4_2_ =
                     ((short)uVar78 < (short)uVar100) * uVar100 |
                     ((short)uVar78 >= (short)uVar100) * uVar78;
                auVar130._6_2_ =
                     ((short)uVar80 < (short)uVar101) * uVar101 |
                     ((short)uVar80 >= (short)uVar101) * uVar80;
                auVar130._8_2_ =
                     ((short)uVar82 < (short)uVar102) * uVar102 |
                     ((short)uVar82 >= (short)uVar102) * uVar82;
                auVar130._10_2_ =
                     ((short)uVar84 < (short)uVar103) * uVar103 |
                     ((short)uVar84 >= (short)uVar103) * uVar84;
                auVar130._12_2_ =
                     ((short)uVar86 < (short)uVar104) * uVar104 |
                     ((short)uVar86 >= (short)uVar104) * uVar86;
                auVar130._14_2_ =
                     ((short)uVar88 < (short)uVar105) * uVar105 |
                     ((short)uVar88 >= (short)uVar105) * uVar88;
                auVar131._0_2_ = -(ushort)(uVar62 == auVar130._0_2_);
                auVar131._2_2_ = -(ushort)(uVar64 == auVar130._2_2_);
                auVar131._4_2_ = -(ushort)(uVar66 == auVar130._4_2_);
                auVar131._6_2_ = -(ushort)(uVar68 == auVar130._6_2_);
                auVar131._8_2_ = -(ushort)(uVar63 == auVar130._8_2_);
                auVar131._10_2_ = -(ushort)(uVar65 == auVar130._10_2_);
                auVar131._12_2_ = -(ushort)(uVar67 == auVar130._12_2_);
                auVar131._14_2_ = -(ushort)(uVar69 == auVar130._14_2_);
                auVar74._0_2_ = -(ushort)((short)uVar98 < (short)uVar71);
                auVar74._2_2_ = -(ushort)((short)uVar99 < (short)uVar76);
                auVar74._4_2_ = -(ushort)((short)uVar100 < (short)uVar78);
                auVar74._6_2_ = -(ushort)((short)uVar101 < (short)uVar80);
                auVar74._8_2_ = -(ushort)((short)uVar102 < (short)uVar82);
                auVar74._10_2_ = -(ushort)((short)uVar103 < (short)uVar84);
                auVar74._12_2_ = -(ushort)((short)uVar104 < (short)uVar86);
                auVar74._14_2_ = -(ushort)((short)uVar105 < (short)uVar88);
                auVar49 = pblendvb(auVar61,auVar107,auVar74);
                local_2c8 = pblendvb(auVar49,auVar125,auVar131);
                auVar126 = pblendvb(auVar118,auVar110,auVar74);
                auVar120._0_2_ =
                     (ushort)-(ushort)(0 < (short)((ulong)(uint)piVar8[(long)(int)(uVar22 * iVar36)
                                                                       + (long)ptr_00[uVar42]] &
                                                  0xffffffff0000ffff)) >> 0xf;
                auVar120._2_2_ =
                     (ushort)-(ushort)(0 < (short)*(ushort *)
                                                   (piVar8 + (long)(int)(uVar24 * iVar36) +
                                                             (long)ptr_00[uVar42 + 1])) >> 0xf;
                auVar120._4_2_ =
                     (ushort)-(ushort)(0 < (short)*(ushort *)
                                                   (piVar8 + (long)(int)(uVar31 * iVar36) +
                                                             (long)ptr_00[uVar42 + 2])) >> 0xf;
                auVar120._6_2_ =
                     (ushort)-(ushort)(0 < (short)*(ushort *)
                                                   (piVar8 + (long)(int)(uVar35 * iVar36) +
                                                             (long)ptr_00[uVar42 + 3])) >> 0xf;
                auVar120._8_2_ =
                     (ushort)-(ushort)(0 < (short)piVar8[(long)(int)(uVar37 * iVar36) +
                                                         (long)ptr_00[uVar42 + 4]]) >> 0xf;
                auVar120._10_2_ =
                     (ushort)-(ushort)(0 < (short)piVar8[(long)(int)(uVar39 * iVar36) +
                                                         (long)ptr_00[uVar42 + 5]]) >> 0xf;
                auVar120._12_2_ =
                     (ushort)-(ushort)(0 < (short)piVar8[(long)(int)(uVar40 * iVar36) +
                                                         (long)ptr_00[uVar42 + 6]]) >> 0xf;
                auVar120._14_2_ =
                     (ushort)-(ushort)(0 < (short)piVar8[(long)(int)(uVar32 * iVar36) + (long)sVar7]
                                      ) >> 0xf;
                auVar49 = paddsw(auVar120,local_128);
                local_308 = pblendvb(auVar126,auVar49,auVar131);
                auVar49 = pmovsxbw(auVar131,0x101010101010101);
                auVar121 = paddsw(auVar123,auVar49);
                auVar112 = paddsw(auVar112,auVar49);
                auVar126 = pblendvb(auVar121,auVar112,auVar74);
                auVar49 = paddsw(local_258,auVar49);
                local_348 = pblendvb(auVar126,auVar49,auVar131);
                auVar127._0_2_ = -(ushort)(in_XMM15._0_2_ == -1);
                auVar127._2_2_ = -(ushort)(in_XMM15._2_2_ == -1);
                auVar127._4_2_ = -(ushort)(in_XMM15._4_2_ == -1);
                auVar127._6_2_ = -(ushort)(in_XMM15._6_2_ == -1);
                auVar127._8_2_ = -(ushort)(in_XMM15._8_2_ == -1);
                auVar127._10_2_ = -(ushort)(in_XMM15._10_2_ == -1);
                auVar127._12_2_ = -(ushort)(in_XMM15._12_2_ == -1);
                auVar127._14_2_ = -(ushort)(in_XMM15._14_2_ == -1);
                auVar131 = pblendvb(auVar130,local_278,auVar127);
                local_2c8 = ~auVar127 & local_2c8;
                local_308 = ~auVar127 & local_308;
                local_348 = ~auVar127 & local_348;
                auVar126._4_2_ = local_288;
                auVar126._0_4_ = uVar45;
                auVar126._6_2_ = sStack_286;
                auVar126._8_2_ = local_288;
                auVar126._10_2_ = sStack_286;
                auVar126._12_2_ = local_288;
                auVar126._14_2_ = sStack_286;
                local_138 = pblendvb(auVar113,auVar126,auVar127);
                uVar19 = (ulong)local_298 >> 0x10;
                local_298 = CONCAT26((short)uStack_290,(int6)uVar19);
                uVar19 = (ulong)uStack_290 >> 0x10;
                uStack_290 = CONCAT26(sVar7,(int6)uVar19);
                sVar51 = auVar131._0_2_;
                sVar7 = local_2c8._0_2_;
                sVar44 = local_348._0_2_;
                sVar53 = local_308._0_2_;
                if (7 < uVar42) {
                  bVar11 = sVar51 < (short)local_218;
                  uVar62 = (ushort)!bVar11 * (short)local_218;
                  sVar54 = auVar131._2_2_;
                  bVar12 = sVar54 < local_218._2_2_;
                  uVar71 = (ushort)!bVar12 * local_218._2_2_;
                  sVar52 = auVar131._4_2_;
                  bVar13 = sVar52 < local_218._4_2_;
                  uVar76 = (ushort)!bVar13 * local_218._4_2_;
                  sVar55 = auVar131._6_2_;
                  sVar56 = auVar131._8_2_;
                  bVar14 = sVar56 < (short)uStack_210;
                  uVar64 = (ushort)!bVar14 * (short)uStack_210;
                  sVar57 = auVar131._10_2_;
                  bVar15 = sVar57 < uStack_210._2_2_;
                  uVar78 = (ushort)!bVar15 * uStack_210._2_2_;
                  sVar70 = auVar131._12_2_;
                  bVar16 = sVar70 < uStack_210._4_2_;
                  uVar66 = (ushort)!bVar16 * uStack_210._4_2_;
                  sVar75 = auVar131._14_2_;
                  local_218 = CONCAT26((ushort)(sVar55 < local_218._6_2_) * sVar55 |
                                       (ushort)(sVar55 >= local_218._6_2_) * local_218._6_2_,
                                       CONCAT24((ushort)bVar13 * sVar52 | uVar76,
                                                CONCAT22((ushort)bVar12 * sVar54 | uVar71,
                                                         (ushort)bVar11 * sVar51 | uVar62)));
                  uStack_210 = CONCAT26((ushort)(sVar75 < uStack_210._6_2_) * sVar75 |
                                        (ushort)(sVar75 >= uStack_210._6_2_) * uStack_210._6_2_,
                                        CONCAT24((ushort)bVar16 * sVar70 | uVar66,
                                                 CONCAT22((ushort)bVar15 * sVar57 | uVar78,
                                                          (ushort)bVar14 * sVar56 | uVar64)));
                  uVar71 = (ushort)((short)local_208._0_2_ < sVar51) * sVar51 |
                           (ushort)((short)local_208._0_2_ >= sVar51) * local_208._0_2_;
                  uVar62 = (ushort)((short)local_208._2_2_ < sVar54) * sVar54 |
                           (ushort)((short)local_208._2_2_ >= sVar54) * local_208._2_2_;
                  uVar76 = (ushort)((short)local_208._4_2_ < sVar52) * sVar52 |
                           (ushort)((short)local_208._4_2_ >= sVar52) * local_208._4_2_;
                  uVar64 = (ushort)((short)local_208._6_2_ < sVar55) * sVar55 |
                           (ushort)((short)local_208._6_2_ >= sVar55) * local_208._6_2_;
                  uVar78 = (ushort)((short)local_208._8_2_ < sVar56) * sVar56 |
                           (ushort)((short)local_208._8_2_ >= sVar56) * local_208._8_2_;
                  uVar66 = (ushort)((short)local_208._10_2_ < sVar57) * sVar57 |
                           (ushort)((short)local_208._10_2_ >= sVar57) * local_208._10_2_;
                  uVar80 = (ushort)((short)local_208._12_2_ < sVar70) * sVar70 |
                           (ushort)((short)local_208._12_2_ >= sVar70) * local_208._12_2_;
                  uVar68 = (ushort)((short)local_208._14_2_ < sVar75) * sVar75 |
                           (ushort)((short)local_208._14_2_ >= sVar75) * local_208._14_2_;
                  uVar82 = (ushort)((short)uVar71 < sVar7) * sVar7 |
                           ((short)uVar71 >= sVar7) * uVar71;
                  sVar54 = local_2c8._2_2_;
                  uVar63 = (ushort)((short)uVar62 < sVar54) * sVar54 |
                           ((short)uVar62 >= sVar54) * uVar62;
                  sVar54 = local_2c8._4_2_;
                  uVar84 = (ushort)((short)uVar76 < sVar54) * sVar54 |
                           ((short)uVar76 >= sVar54) * uVar76;
                  sVar54 = local_2c8._6_2_;
                  uVar65 = (ushort)((short)uVar64 < sVar54) * sVar54 |
                           ((short)uVar64 >= sVar54) * uVar64;
                  sVar54 = local_2c8._8_2_;
                  uVar86 = (ushort)((short)uVar78 < sVar54) * sVar54 |
                           ((short)uVar78 >= sVar54) * uVar78;
                  sVar54 = local_2c8._10_2_;
                  uVar67 = (ushort)((short)uVar66 < sVar54) * sVar54 |
                           ((short)uVar66 >= sVar54) * uVar66;
                  sVar54 = local_2c8._12_2_;
                  uVar88 = (ushort)((short)uVar80 < sVar54) * sVar54 |
                           ((short)uVar80 >= sVar54) * uVar80;
                  sVar54 = local_2c8._14_2_;
                  uVar69 = (ushort)((short)uVar68 < sVar54) * sVar54 |
                           ((short)uVar68 >= sVar54) * uVar68;
                  uVar71 = (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
                  sVar54 = local_348._2_2_;
                  sVar52 = local_308._2_2_;
                  uVar62 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._4_2_;
                  sVar52 = local_308._4_2_;
                  uVar76 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._6_2_;
                  sVar52 = local_308._6_2_;
                  uVar64 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._8_2_;
                  sVar52 = local_308._8_2_;
                  uVar78 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._10_2_;
                  sVar52 = local_308._10_2_;
                  uVar66 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._12_2_;
                  sVar52 = local_308._12_2_;
                  sVar55 = local_308._14_2_;
                  uVar80 = (ushort)(sVar52 < sVar54) * sVar54 | (ushort)(sVar52 >= sVar54) * sVar52;
                  sVar54 = local_348._14_2_;
                  uVar68 = (ushort)(sVar55 < sVar54) * sVar54 | (ushort)(sVar55 >= sVar54) * sVar55;
                  local_208._2_2_ =
                       ((short)uVar63 < (short)uVar62) * uVar62 |
                       ((short)uVar63 >= (short)uVar62) * uVar63;
                  local_208._0_2_ =
                       ((short)uVar82 < (short)uVar71) * uVar71 |
                       ((short)uVar82 >= (short)uVar71) * uVar82;
                  local_208._4_2_ =
                       ((short)uVar84 < (short)uVar76) * uVar76 |
                       ((short)uVar84 >= (short)uVar76) * uVar84;
                  local_208._6_2_ =
                       ((short)uVar65 < (short)uVar64) * uVar64 |
                       ((short)uVar65 >= (short)uVar64) * uVar65;
                  local_208._8_2_ =
                       ((short)uVar86 < (short)uVar78) * uVar78 |
                       ((short)uVar86 >= (short)uVar78) * uVar86;
                  local_208._10_2_ =
                       ((short)uVar67 < (short)uVar66) * uVar66 |
                       ((short)uVar67 >= (short)uVar66) * uVar67;
                  local_208._12_2_ =
                       ((short)uVar88 < (short)uVar80) * uVar80 |
                       ((short)uVar88 >= (short)uVar80) * uVar88;
                  local_208._14_2_ =
                       ((short)uVar69 < (short)uVar68) * uVar68 |
                       ((short)uVar69 >= (short)uVar68) * uVar69;
                }
                auVar112 = ~auVar127 & auVar112;
                puVar9 = (undefined8 *)((ppVar25->field_4).trace)->trace_del_table;
                vWH[0] = uVar29 & 0xffffffff;
                i = (int32_t)uVar42;
                vWH[1] = uVar33;
                auVar126 = auVar112;
                arr_store_rowcol((int *)*puVar9,(int *)puVar9[4],vWH,i,s2Len,
                                 in_stack_fffffffffffffca8,s2Len_00);
                pvVar10 = ((ppVar25->field_4).trace)->trace_del_table;
                vWH_00[1] = uVar33;
                vWH_00[0] = uVar29 & 0xffffffff;
                arr_store_rowcol(*(int **)((long)pvVar10 + 8),*(int **)((long)pvVar10 + 0x28),vWH_00
                                 ,i,s2Len,in_stack_fffffffffffffca8,s2Len_00);
                pvVar10 = ((ppVar25->field_4).trace)->trace_del_table;
                vWH_01[0] = uVar29 & 0xffffffff;
                vWH_01[1] = uVar33;
                arr_store_rowcol(*(int **)((long)pvVar10 + 0x10),*(int **)((long)pvVar10 + 0x30),
                                 vWH_01,i,s2Len,in_stack_fffffffffffffca8,s2Len_00);
                pvVar10 = ((ppVar25->field_4).trace)->trace_del_table;
                vWH_02[0] = uVar29 & 0xffffffff;
                vWH_02[1] = uVar33;
                arr_store_rowcol(*(int **)((long)pvVar10 + 0x18),*(int **)((long)pvVar10 + 0x38),
                                 vWH_02,i,s2Len,in_stack_fffffffffffffca8,s2Len_00);
                local_1f8._0_2_ = auVar73._0_2_;
                local_1f8._2_2_ = auVar73._2_2_;
                local_1f8._4_2_ = auVar73._4_2_;
                local_1f8._6_2_ = auVar73._6_2_;
                local_1f8._8_2_ = auVar73._8_2_;
                local_1f8._10_2_ = auVar73._10_2_;
                local_1f8._12_2_ = auVar73._12_2_;
                local_1f8._14_2_ = auVar73._14_2_;
                auVar50._0_2_ = -(ushort)(in_XMM15._0_2_ == local_1f8._0_2_);
                auVar50._2_2_ = -(ushort)(in_XMM15._2_2_ == local_1f8._2_2_);
                auVar50._4_2_ = -(ushort)(in_XMM15._4_2_ == local_1f8._4_2_);
                auVar50._6_2_ = -(ushort)(in_XMM15._6_2_ == local_1f8._6_2_);
                auVar50._8_2_ = -(ushort)(in_XMM15._8_2_ == local_1f8._8_2_);
                auVar50._10_2_ = -(ushort)(in_XMM15._10_2_ == local_1f8._10_2_);
                auVar50._12_2_ = -(ushort)(in_XMM15._12_2_ == local_1f8._12_2_);
                auVar50._14_2_ = -(ushort)(in_XMM15._14_2_ == local_1f8._14_2_);
                auVar17._2_2_ = -(ushort)(auVar60._2_2_ == local_238._2_2_);
                auVar17._0_2_ = -(ushort)(auVar60._0_2_ == local_238._0_2_);
                auVar17._4_2_ = -(ushort)(auVar60._4_2_ == local_238._4_2_);
                auVar17._6_2_ = -(ushort)(auVar60._6_2_ == local_238._6_2_);
                auVar17._8_2_ = -(ushort)(auVar60._8_2_ == local_238._8_2_);
                auVar17._10_2_ = -(ushort)(auVar60._10_2_ == local_238._10_2_);
                auVar17._12_2_ = -(ushort)(auVar60._12_2_ == local_238._12_2_);
                auVar17._14_2_ = -(ushort)(auVar60._14_2_ == local_238._14_2_);
                auVar50 = auVar50 & auVar17;
                auVar116 = pblendvb(auVar116,auVar131,auVar50);
                auVar114 = pblendvb(auVar114,local_2c8,auVar50);
                auVar59 = pblendvb(auVar59,local_308,auVar50);
                ptr_01[uVar42] = sVar51;
                ptr_02[uVar42] = sVar7;
                ptr_03[uVar42] = sVar53;
                ptr_04[uVar42] = sVar44;
                auVar49._2_2_ = uVar99;
                auVar49._0_2_ = uVar98;
                auVar49._4_2_ = uVar100;
                auVar49._6_2_ = uVar101;
                auVar49._8_2_ = uVar102;
                auVar49._10_2_ = uVar103;
                auVar49._12_2_ = uVar104;
                auVar49._14_2_ = uVar105;
                ptr_05[uVar42] = uVar98;
                ptr_06[uVar42] = auVar61._0_2_;
                ptr_07[uVar42] = auVar118._0_2_;
                ptr_08[uVar42] = auVar121._0_2_;
                auVar46 = pblendvb(auVar46,local_348,auVar50);
                auVar126 = pmovsxbw(auVar126,0x101010101010101);
                in_XMM15 = paddsw(in_XMM15,auVar126);
                uVar42 = uVar42 + 1;
                local_c8 = auVar112._0_8_;
                uStack_c0 = auVar112._8_8_;
                local_1e8 = SUB168(~auVar127 & auVar110,0);
                uStack_1e0 = SUB168(~auVar127 & auVar110,8);
                local_1d8 = SUB168(~auVar127 & auVar107,0);
                uStack_1d0 = SUB168(~auVar127 & auVar107,8);
                auVar126 = auVar48;
                local_258 = auVar109;
                local_128 = auVar106;
              } while (uVar27 != uVar42);
              auVar60 = paddsw(auVar60,_DAT_008d0b90);
              local_278 = psubsw(local_278,auVar90);
              uVar29 = uVar43;
            } while (uVar43 < uVar33);
          }
          iVar36 = 8;
          uVar32 = s2Len_00;
          uVar22 = s2Len_00;
          uVar24 = s2Len_00;
          do {
            uVar41 = auVar116._0_8_;
            lVar117 = auVar116._8_8_;
            uVar29 = auVar114._0_8_;
            lVar115 = auVar114._8_8_;
            uVar27 = auVar59._0_8_;
            lVar26 = auVar59._8_8_;
            uVar33 = auVar46._0_8_;
            lVar111 = auVar46._8_8_;
            if ((short)s2Len_00 < (short)auVar116._14_2_) {
              uVar32 = (uint)auVar114._14_2_;
              uVar24 = (uint)auVar59._14_2_;
              uVar22 = (uint)auVar46._14_2_;
              s2Len_00 = (uint)auVar116._14_2_;
            }
            sVar28 = (short)uVar22;
            sVar20 = (short)uVar24;
            sVar30 = (short)uVar32;
            sVar38 = (short)s2Len_00;
            auVar116._0_8_ = uVar41 << 0x10;
            auVar116._8_8_ = lVar117 << 0x10 | uVar41 >> 0x30;
            auVar114._0_8_ = uVar29 << 0x10;
            auVar114._8_8_ = lVar115 << 0x10 | uVar29 >> 0x30;
            auVar59._0_8_ = uVar27 << 0x10;
            auVar59._8_8_ = lVar26 << 0x10 | uVar27 >> 0x30;
            auVar46._0_8_ = uVar33 << 0x10;
            auVar46._8_8_ = lVar111 << 0x10 | uVar33 >> 0x30;
            iVar36 = iVar36 + -1;
          } while (iVar36 != 0);
          auVar47._0_2_ = -(ushort)((short)local_218 < local_288);
          auVar47._2_2_ = -(ushort)(local_218._2_2_ < sStack_286);
          auVar47._4_2_ = -(ushort)(local_218._4_2_ < local_288);
          auVar47._6_2_ = -(ushort)(local_218._6_2_ < sStack_286);
          auVar47._8_2_ = -(ushort)((short)uStack_210 < local_288);
          auVar47._10_2_ = -(ushort)(uStack_210._2_2_ < sStack_286);
          auVar47._12_2_ = -(ushort)(uStack_210._4_2_ < local_288);
          auVar47._14_2_ = -(ushort)(uStack_210._6_2_ < sStack_286);
          auVar60._0_2_ = -(ushort)(local_248 < local_208._0_2_);
          auVar60._2_2_ = -(ushort)(sStack_246 < local_208._2_2_);
          auVar60._4_2_ = -(ushort)(local_248 < local_208._4_2_);
          auVar60._6_2_ = -(ushort)(sStack_246 < local_208._6_2_);
          auVar60._8_2_ = -(ushort)(local_248 < local_208._8_2_);
          auVar60._10_2_ = -(ushort)(sStack_246 < local_208._10_2_);
          auVar60._12_2_ = -(ushort)(local_248 < local_208._12_2_);
          auVar60._14_2_ = -(ushort)(sStack_246 < local_208._14_2_);
          auVar60 = auVar60 | auVar47;
          if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar60 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
            sVar20 = 0;
            sVar28 = 0;
            sVar30 = 0;
            sVar38 = 0;
            iVar23 = 0;
            local_34c = 0;
          }
          ppVar25->score = (int)sVar38;
          ppVar25->end_query = local_34c;
          ppVar25->end_ref = iVar23;
          *(int *)(ppVar25->field_4).extra = (int)sVar30;
          ((ppVar25->field_4).stats)->similar = (int)sVar20;
          ((ppVar25->field_4).stats)->length = (int)sVar28;
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar25;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vNegInf0 = _mm_insert_epi16(vZero, NEG_LIMIT, 7);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
            matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
            similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
            length= (int16_t) _mm_extract_epi16(vMaxL, 7);
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
        vMaxM = _mm_slli_si128(vMaxM, 2);
        vMaxS = _mm_slli_si128(vMaxS, 2);
        vMaxL = _mm_slli_si128(vMaxL, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}